

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hh
# Opt level: O1

void __thiscall kratos::Var::~Var(Var *this)

{
  ~Var(this);
  operator_delete(this,0x270);
  return;
}

Assistant:

~Var() override = default;